

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall Board::newBoard(Board *this,Vector2u *size,string *filename,bool startEmpty)

{
  long lVar1;
  Tile ***pppTVar2;
  ulong uVar3;
  Tile **ppTVar4;
  Tile *this_00;
  runtime_error *this_01;
  ulong uVar5;
  ulong uVar6;
  Vector2u local_50 [2];
  undefined1 local_40 [16];
  
  if ((size->x != 0) && (size->y != 0)) {
    lVar1 = std::__cxx11::string::rfind((char)filename,0x2e);
    if (lVar1 == -1) {
      std::__cxx11::string::_M_assign((string *)&this->name);
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)filename);
      std::__cxx11::string::operator=((string *)&this->name,(string *)local_50);
      if ((undefined1 *)CONCAT44(local_50[0].y,local_50[0].x) != local_40) {
        operator_delete((undefined1 *)CONCAT44(local_50[0].y,local_50[0].x));
      }
    }
    clear(this);
    sf::VertexArray::resize(&this->_vertices,(ulong)(size->x * size->y * 4));
    this->_size = *size;
    _setVertexCoords(this);
    uVar5 = (ulong)size->y;
    pppTVar2 = (Tile ***)operator_new__(uVar5 * 8);
    this->_tileArray = pppTVar2;
    if (uVar5 != 0) {
      uVar3 = (ulong)size->x;
      uVar6 = 0;
      do {
        ppTVar4 = (Tile **)operator_new__(uVar3 << 3);
        this->_tileArray[uVar6] = ppTVar4;
        uVar3 = (ulong)size->x;
        if (size->x != 0 && !startEmpty) {
          uVar5 = 0;
          do {
            this_00 = (Tile *)operator_new(0x28);
            local_50[0].x = (uint)uVar5;
            local_50[0].y = (uint)uVar6;
            Tile::Tile(this_00,this,local_50,true,false);
            this->_tileArray[uVar6][uVar5] = this_00;
            uVar5 = uVar5 + 1;
            uVar3 = (ulong)size->x;
          } while (uVar5 < uVar3);
          uVar5 = (ulong)size->y;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar5);
    }
    this->changesMade = false;
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Board dimensions cannot be zero or negative.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Board::newBoard(const Vector2u& size, const string& filename, bool startEmpty) {
    if (size.x == 0 || size.y == 0) {
        throw runtime_error("Board dimensions cannot be zero or negative.");
    }
    size_t dotPosition = filename.rfind('.');
    if (dotPosition != string::npos) {
        name = filename.substr(0, dotPosition);
    } else {
        name = filename;
    }
    clear();
    
    _vertices.resize(size.x * size.y * 4);
    _size = size;
    _setVertexCoords();
    _tileArray = new Tile**[size.y];
    for (unsigned int y = 0; y < size.y; ++y) {    // Create new board and add blank tiles if startEmpty is false.
        _tileArray[y] = new Tile*[size.x];
        if (!startEmpty) {
            for (unsigned int x = 0; x < size.x; ++x) {
                _tileArray[y][x] = new Tile(this, Vector2u(x, y), true);
            }
        }
    }
    changesMade = false;
}